

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::Encode
          (Transfer_Control_Request_PDU *this,KDataStream *stream)

{
  pointer pRVar1;
  pointer pRVar2;
  KDataStream KStack_48;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32ReqID);
  KDataStream::Write(stream,this->m_ui8ReqRelSrv);
  KDataStream::Write(stream,this->m_ui8TrnTyp);
  (*(this->m_TrnsEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_TrnsEntID,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumRecSets);
  pRVar1 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar2 = (this->m_vRecs).
                super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    (*(pRVar2->super_DataTypeBase)._vptr_DataTypeBase[4])(&KStack_48,pRVar2);
    KDataStream::operator<<(stream,&KStack_48);
    KDataStream::~KDataStream(&KStack_48);
  }
  return;
}

Assistant:

void Transfer_Control_Request_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32ReqID
           << m_ui8ReqRelSrv
           << m_ui8TrnTyp
           << KDIS_STREAM m_TrnsEntID
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}